

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# io.h
# Opt level: O2

void io::save<double>(vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
                      *data,string *file_name)

{
  long lVar1;
  char cVar2;
  ostream *poVar3;
  pointer pvVar4;
  uint uVar5;
  ulong uVar6;
  uint uVar7;
  ulong uVar8;
  ofstream file;
  undefined8 auStack_228 [63];
  
  std::ofstream::ofstream(&file);
  std::ofstream::open((char *)&file,(_Ios_Openmode)(file_name->_M_dataplus)._M_p);
  cVar2 = std::__basic_file<char>::is_open();
  if (cVar2 != '\0') {
    *(undefined8 *)((long)auStack_228 + *(long *)(_file + -0x18)) = 0x10;
    uVar7 = 0;
    while( true ) {
      uVar8 = (ulong)uVar7;
      pvVar4 = (data->
               super__Vector_base<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
               )._M_impl.super__Vector_impl_data._M_start;
      if ((ulong)(((long)(data->
                         super__Vector_base<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
                         )._M_impl.super__Vector_impl_data._M_finish - (long)pvVar4) / 0x18) <=
          uVar8) break;
      uVar5 = 0;
      while( true ) {
        uVar6 = (ulong)uVar5;
        lVar1 = *(long *)&pvVar4[uVar8].super__Vector_base<double,_std::allocator<double>_>._M_impl.
                          super__Vector_impl_data;
        if ((ulong)((long)*(pointer *)
                           ((long)&pvVar4[uVar8].super__Vector_base<double,_std::allocator<double>_>
                                   ._M_impl.super__Vector_impl_data + 8) - lVar1 >> 3) <= uVar6)
        break;
        std::ostream::_M_insert<double>(*(double *)(lVar1 + uVar6 * 8));
        pvVar4 = (data->
                 super__Vector_base<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
                 )._M_impl.super__Vector_impl_data._M_start;
        if (((long)*(pointer *)
                    ((long)&pvVar4[uVar6].super__Vector_base<double,_std::allocator<double>_>.
                            _M_impl.super__Vector_impl_data + 8) -
             *(long *)&pvVar4[uVar6].super__Vector_base<double,_std::allocator<double>_>._M_impl.
                       super__Vector_impl_data >> 3) - 1U != uVar6) {
          std::operator<<((ostream *)&file," ");
          pvVar4 = (data->
                   super__Vector_base<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
                   )._M_impl.super__Vector_impl_data._M_start;
        }
        uVar5 = uVar5 + 1;
      }
      std::endl<char,std::char_traits<char>>((ostream *)&file);
      uVar7 = uVar7 + 1;
    }
    std::ofstream::close();
    std::ofstream::~ofstream(&file);
    return;
  }
  poVar3 = std::operator<<((ostream *)&std::cout,"file \"");
  poVar3 = std::operator<<(poVar3,(string *)file_name);
  poVar3 = std::operator<<(poVar3,"\" not found");
  std::endl<char,std::char_traits<char>>(poVar3);
  exit(1);
}

Assistant:

void save(std::vector<std::vector<T> > const& data, std::string file_name) {
        std::ofstream file;
        file.open(file_name.c_str());
        if(!file.is_open())
        {
            std::cout << "file \"" << file_name << "\" not found" << std::endl;
            exit(1);
        }

        file.precision(std::numeric_limits<T>::digits10 + 1);
        for(unsigned int i = 0; i < data.size(); i++)
        {
            for(unsigned int j = 0; j < data[i].size(); j++)
            {
                file << data[i][j];
                if (j != data[j].size() - 1)
                    file << " ";
            }
            file << std::endl;
        }
        file.close();
    }